

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_operations.hpp
# Opt level: O2

bool viennamath::can_simplify_impl<viennamath::rt_expression_interface<double>,double>
               (long *lhs,long *param_2)

{
  char cVar1;
  undefined1 uVar2;
  double dVar3;
  
  cVar1 = (**(code **)(*lhs + 0x40))();
  if (cVar1 != '\0') {
    dVar3 = (double)(**(code **)(*lhs + 0x48))(lhs);
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      return true;
    }
  }
  cVar1 = (**(code **)(*param_2 + 0x40))(param_2);
  if (cVar1 != '\0') {
    dVar3 = (double)(**(code **)(*param_2 + 0x48))(param_2);
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      return true;
    }
  }
  cVar1 = (**(code **)(*lhs + 0x88))(lhs);
  if (cVar1 != '\0') {
    return true;
  }
  uVar2 = (**(code **)(*param_2 + 0x88))(param_2);
  return (bool)uVar2;
}

Assistant:

bool can_simplify_impl(const InterfaceType * lhs, op_plus<NumericT>, const InterfaceType * rhs)
  {
      if (lhs->is_constant())
      {
        if (lhs->unwrap() == 0.0)
        {
          //std::cout << "can_simplify: true in op_plus" << std::endl;
          return true;
        }
      }
      if (rhs->is_constant())
      {
        if (rhs->unwrap() == 0.0)
        {
          //std::cout << "can_simplify: true in op_plus" << std::endl;
          return true;
        }
      }
      return lhs->can_simplify() || rhs->can_simplify();
  }